

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_array.h
# Opt level: O1

bool __thiscall re2::Compiler::ByteRangeEqual(Compiler *this,int id1,int id2)

{
  Inst *pIVar1;
  
  pIVar1 = (this->inst_).ptr_._M_t.
           super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
           super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
           super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
  if ((pIVar1[id1].field_1.field_3.lo_ == pIVar1[id2].field_1.field_3.lo_) &&
     (pIVar1[id1].field_1.field_3.hi_ == pIVar1[id2].field_1.field_3.hi_)) {
    return ((pIVar1[id2].field_1.field_3.hint_foldcase_ ^ pIVar1[id1].field_1.field_3.hint_foldcase_
            ) & 1) == 0;
  }
  return false;
}

Assistant:

T& operator[](int pos) const {
    return ptr_[pos];
  }